

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  short sVar2;
  uchar *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  int cx;
  int cy;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  int num_vertices;
  int iVar13;
  stbtt_vertex *psVar14;
  ulong uVar15;
  ushort *puVar16;
  stbtt_vertex *psVar17;
  ulong uVar18;
  short sVar19;
  int was_off;
  int iVar20;
  stbtt_int32 cx_00;
  stbtt_int32 sVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  byte bVar25;
  short sVar26;
  int sx;
  byte bVar27;
  int sy;
  ushort *puVar28;
  ushort uVar29;
  stbtt_int32 cy_00;
  stbtt_int32 sVar30;
  ulong uVar31;
  int iVar32;
  uint start_off;
  float fVar33;
  float fVar34;
  float fVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  stbtt__csctx count_ctx;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  if ((info->cff).size != 0) {
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx._4_12_ = SUB1612((undefined1  [16])0x0,4);
    count_ctx.bounds = 1;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    iVar11 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar11 != 0) {
      psVar14 = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = psVar14;
      local_48._8_8_ = psVar14;
      iVar11 = stbtt__run_charstring(info,glyph_index,(stbtt__csctx *)local_68);
      if (iVar11 != 0) {
        return (int)local_38;
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
    return 0;
  }
  puVar3 = info->data;
  uVar12 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  if ((int)uVar12 < 0) {
LAB_001ae94c:
    iVar11 = 0;
  }
  else {
    uVar15 = (ulong)uVar12;
    uVar10 = CONCAT11(puVar3[uVar15],puVar3[uVar15 + 1]);
    if ((short)uVar10 < 1) {
      if ((short)((ushort)puVar3[uVar15] << 8) < 0) {
        puVar16 = (ushort *)(puVar3 + uVar15 + 10);
        uVar15 = 0;
        psVar14 = (stbtt_vertex *)0x0;
        bVar25 = 1;
        do {
          bVar27 = bVar25;
          iVar11 = (int)uVar15;
          if (bVar27 == 0) break;
          auVar36._8_8_ = 0;
          auVar36._0_4_ = count_ctx.first_x;
          auVar36._4_4_ = count_ctx.first_y;
          count_ctx._0_16_ = auVar36 << 0x40;
          bVar25 = *(byte *)((long)puVar16 + 1);
          puVar28 = puVar16 + 2;
          fVar40 = 0.0;
          fVar41 = 0.0;
          if ((bVar25 & 2) != 0) {
            if ((bVar25 & 1) == 0) {
              fVar40 = (float)(int)(char)*puVar28;
              fVar41 = (float)(int)((long)((ulong)*(byte *)((long)puVar16 + 5) << 0x38) >> 0x38);
              puVar28 = puVar16 + 3;
            }
            else {
              auVar7._9_7_ = 0;
              auVar7._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
              auVar6._10_6_ = 0;
              auVar6._0_10_ = SUB1610(auVar7 << 0x38,6);
              auVar5._11_5_ = 0;
              auVar5._0_11_ = SUB1611(auVar6 << 0x30,5);
              auVar8._1_12_ = SUB1612(auVar5 << 0x28,4);
              auVar8[0] = (char)puVar16[3];
              auVar8._13_3_ = 0;
              auVar4._1_14_ = SUB1614(auVar8 << 0x18,2);
              auVar4[0] = (char)*puVar28;
              auVar4[0xf] = 0;
              auVar36 = ZEXT416((uint)*(byte *)((long)puVar16 + 7) << 0x10 |
                                (uint)*(byte *)((long)puVar16 + 5)) | auVar4 << 8;
              fVar40 = (float)(int)auVar36._0_2_;
              fVar41 = (float)(int)auVar36._2_2_;
              puVar28 = puVar16 + 4;
            }
          }
          uVar10 = puVar16[1];
          if ((bVar25 & 8) == 0) {
            if ((bVar25 & 0x40) != 0) {
              fVar42 = (float)(int)(short)(*puVar28 << 8 | *puVar28 >> 8) * 6.1035156e-05;
              puVar16 = puVar28 + 2;
              fVar45 = (float)(int)(short)(puVar28[1] << 8 | puVar28[1] >> 8) * 6.1035156e-05;
              goto LAB_001ae682;
            }
            if ((char)bVar25 < '\0') {
              fVar42 = (float)(int)CONCAT11((char)*puVar28,*(char *)((long)puVar28 + 1)) *
                       6.1035156e-05;
              fVar43 = (float)(int)((long)((ulong)CONCAT11((char)puVar28[1],
                                                           *(char *)((long)puVar28 + 3)) << 0x30) >>
                                   0x30) * 6.1035156e-05;
              fVar44 = (float)(int)CONCAT11((char)puVar28[2],*(char *)((long)puVar28 + 5)) *
                       6.1035156e-05;
              fVar45 = (float)(int)((long)((ulong)CONCAT11((char)puVar28[3],
                                                           *(char *)((long)puVar28 + 7)) << 0x30) >>
                                   0x30) * 6.1035156e-05;
              puVar16 = puVar28 + 4;
            }
            else {
              fVar42 = 1.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 1.0;
              puVar16 = puVar28;
            }
          }
          else {
            fVar42 = (float)(int)(short)(*puVar28 << 8 | *puVar28 >> 8) * 6.1035156e-05;
            puVar16 = puVar28 + 1;
            fVar45 = fVar42;
LAB_001ae682:
            fVar43 = 0.0;
            fVar44 = 0.0;
          }
          fVar33 = fVar42 * fVar42 + fVar43 * fVar43;
          if (fVar33 < 0.0) {
            fVar33 = sqrtf(fVar33);
          }
          else {
            fVar33 = SQRT(fVar33);
          }
          fVar34 = fVar44 * fVar44 + fVar45 * fVar45;
          if (fVar34 < 0.0) {
            fVar34 = sqrtf(fVar34);
          }
          else {
            fVar34 = SQRT(fVar34);
          }
          uVar12 = stbtt_GetGlyphShape(info,(uint)(ushort)(uVar10 << 8 | uVar10 >> 8),
                                       (stbtt_vertex **)&count_ctx);
          if ((int)uVar12 < 1) {
LAB_001ae868:
            bVar9 = true;
            bVar25 = bVar25 & 0x20;
          }
          else {
            lVar23 = 0;
            do {
              fVar37 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + lVar23) << 0x30)
                                   >> 0x30);
              fVar38 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar23);
              fVar39 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + lVar23) << 0x30)
                                   >> 0x30);
              auVar35._0_4_ =
                   (int)((fVar38 * fVar44 +
                          (float)(int)*(short *)(count_ctx._0_8_ + lVar23) * fVar42 + fVar40) *
                        fVar33);
              auVar35._4_4_ =
                   (int)((fVar38 * fVar45 +
                          (float)(int)*(short *)(count_ctx._0_8_ + lVar23) * fVar43 + fVar41) *
                        fVar34);
              auVar35._8_4_ = (int)((fVar39 * fVar44 + fVar37 * fVar42 + fVar40) * fVar33);
              auVar35._12_4_ = (int)((fVar39 * fVar45 + fVar37 * fVar43 + fVar41) * fVar34);
              auVar36 = packssdw(auVar35,auVar35);
              *(long *)(count_ctx._0_8_ + lVar23) = auVar36._0_8_;
              lVar23 = lVar23 + 0xe;
            } while ((ulong)uVar12 * 0xe != lVar23);
            psVar17 = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar12 + iVar11) * 0xe);
            if (psVar17 != (stbtt_vertex *)0x0) {
              if ((0 < iVar11) && (psVar14 != (stbtt_vertex *)0x0)) {
                memcpy(psVar17,psVar14,uVar15 * 0xe);
              }
              memcpy(psVar17 + uVar15,(void *)count_ctx._0_8_,(ulong)uVar12 * 0xe);
              if (psVar14 != (stbtt_vertex *)0x0) {
                ImGui::MemFree(psVar14);
              }
              ImGui::MemFree((void *)count_ctx._0_8_);
              uVar15 = (ulong)(uVar12 + iVar11);
              psVar14 = psVar17;
              goto LAB_001ae868;
            }
            if (psVar14 != (stbtt_vertex *)0x0) {
              ImGui::MemFree(psVar14);
            }
            if (count_ctx._0_8_ != 0) {
              ImGui::MemFree((void *)count_ctx._0_8_);
            }
            bVar9 = false;
            bVar25 = bVar27;
          }
          iVar11 = (int)uVar15;
        } while (bVar9);
        if (bVar27 != 0) goto LAB_001ae94c;
      }
      else {
        iVar11 = 0;
        psVar14 = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar12 = (uint)uVar10 * 2;
      uVar31 = (ulong)uVar12;
      bVar25 = puVar3[uVar31 + uVar15 + 10];
      bVar27 = puVar3[uVar31 + uVar15 + 0xb];
      iVar20 = (uint)puVar3[uVar31 + uVar15 + 8] * 0x100;
      bVar1 = puVar3[uVar31 + uVar15 + 9];
      psVar14 = (stbtt_vertex *)
                ImGui::MemAlloc((ulong)((iVar20 + (uint)bVar1 + (uint)uVar10 * 2) * 0xe + 0xe));
      iVar11 = 0;
      if (psVar14 != (stbtt_vertex *)0x0) {
        puVar16 = (ushort *)(puVar3 + (ulong)bVar25 * 0x100 + (ulong)bVar27 + uVar31 + uVar15 + 0xc)
        ;
        uVar18 = (ulong)(iVar20 + (uint)bVar1);
        lVar23 = 0;
        bVar25 = 0;
        bVar27 = 0;
        do {
          if (bVar27 == 0) {
            bVar25 = (byte)*puVar16;
            if ((bVar25 & 8) == 0) {
              puVar16 = (ushort *)((long)puVar16 + 1);
            }
            else {
              bVar27 = *(byte *)((long)puVar16 + 1);
              puVar16 = puVar16 + 1;
            }
          }
          else {
            bVar27 = bVar27 - 1;
          }
          *(byte *)((long)psVar14 + lVar23 + (ulong)uVar10 * 0x20 + uVar31 * -2 + 0xc) = bVar25;
          lVar23 = lVar23 + 0xe;
        } while ((ulong)((iVar20 + (uint)bVar1 + 1) * 0x10) - (uVar18 * 2 + 2) != lVar23);
        lVar23 = (ulong)(uint)((int)(uVar31 & 0xffff) << 4) + (uVar31 & 0xffff) * -2;
        lVar24 = 0;
        sVar26 = 0;
        do {
          bVar25 = *(byte *)((long)psVar14 + lVar24 + lVar23 + 0xc);
          if ((bVar25 & 2) == 0) {
            if ((bVar25 & 0x10) == 0) {
              sVar26 = sVar26 + (*puVar16 << 8 | *puVar16 >> 8);
              puVar16 = puVar16 + 1;
            }
          }
          else {
            uVar10 = *puVar16;
            puVar16 = (ushort *)((long)puVar16 + 1);
            uVar29 = -(ushort)(byte)uVar10;
            if ((bVar25 & 0x10) != 0) {
              uVar29 = (ushort)(byte)uVar10;
            }
            sVar26 = sVar26 + uVar29;
          }
          *(short *)((long)psVar14 + lVar24 + lVar23) = sVar26;
          lVar24 = lVar24 + 0xe;
        } while ((ulong)((iVar20 + (uint)bVar1 + 1) * 0x10) - (uVar18 * 2 + 2) != lVar24);
        lVar24 = (ulong)((uVar12 & 0xffff) << 4) + (ulong)(uVar12 & 0xffff) * -2;
        lVar23 = 0;
        sVar26 = 0;
        do {
          bVar25 = *(byte *)((long)psVar14 + lVar23 + lVar24 + 0xc);
          if ((bVar25 & 4) == 0) {
            if ((bVar25 & 0x20) == 0) {
              sVar26 = sVar26 + (*puVar16 << 8 | *puVar16 >> 8);
              puVar16 = puVar16 + 1;
            }
          }
          else {
            uVar10 = *puVar16;
            puVar16 = (ushort *)((long)puVar16 + 1);
            uVar29 = -(ushort)(byte)uVar10;
            if ((bVar25 & 0x20) != 0) {
              uVar29 = (ushort)(byte)uVar10;
            }
            sVar26 = sVar26 + uVar29;
          }
          *(short *)((long)psVar14 + lVar23 + lVar24 + 2) = sVar26;
          lVar23 = lVar23 + 0xe;
        } while ((ulong)((iVar20 + (uint)bVar1 + 1) * 0x10) - (uVar18 * 2 + 2) != lVar23);
        num_vertices = 0;
        iVar11 = 0;
        iVar32 = 0;
        iVar13 = 0;
        sVar30 = 0;
        sVar21 = 0;
        sy = 0;
        sx = 0;
        start_off = 0;
        was_off = 0;
        cx = 0;
        cy = 0;
        do {
          lVar23 = (long)(int)(uVar12 + iVar11);
          bVar25 = psVar14[lVar23].type;
          sVar26 = psVar14[lVar23].x;
          sVar2 = psVar14[lVar23].y;
          cx_00 = (stbtt_int32)sVar26;
          cy_00 = (stbtt_int32)sVar2;
          if (iVar13 == iVar11) {
            if (iVar11 != 0) {
              num_vertices = stbtt__close_shape(psVar14,num_vertices,was_off,start_off,sx,sy,sVar21,
                                                sVar30,cx,cy);
            }
            sx = cx_00;
            sy = cy_00;
            if ((bVar25 & 1) == 0) {
              sVar21 = cx_00;
              sVar30 = cy_00;
              if ((psVar14[lVar23 + 1].type & 1) == 0) {
                sx = psVar14[lVar23 + 1].x + cx_00 >> 1;
                sy = psVar14[lVar23 + 1].y + cy_00 >> 1;
              }
              else {
                iVar11 = iVar11 + 1;
                sx = (int)psVar14[lVar23 + 1].x;
                sy = (int)psVar14[lVar23 + 1].y;
              }
            }
            start_off = bVar25 & 1 ^ 1;
            psVar14[num_vertices].type = '\x01';
            psVar14[num_vertices].x = (short)sx;
            psVar14[num_vertices].y = (short)sy;
            psVar14[num_vertices].cx = 0;
            psVar14[num_vertices].cy = 0;
            iVar13 = (ushort)(*(ushort *)(puVar3 + (long)iVar32 * 2 + uVar15 + 10) << 8 |
                             *(ushort *)(puVar3 + (long)iVar32 * 2 + uVar15 + 10) >> 8) + 1;
            iVar32 = iVar32 + 1;
            was_off = 0;
            iVar22 = iVar11;
            num_vertices = num_vertices + 1;
            cx_00 = cx;
            cy_00 = cy;
          }
          else {
            sVar19 = (short)cy;
            iVar22 = iVar11;
            if ((bVar25 & 1) == 0) {
              iVar11 = num_vertices;
              if (was_off != 0) {
                iVar11 = num_vertices + 1;
                psVar14[num_vertices].type = '\x03';
                psVar14[num_vertices].x = (short)((uint)(cx + cx_00) >> 1);
                psVar14[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                psVar14[num_vertices].cx = (short)cx;
                psVar14[num_vertices].cy = sVar19;
              }
              was_off = 1;
              num_vertices = iVar11;
            }
            else {
              psVar17 = psVar14 + num_vertices;
              if (was_off == 0) {
                psVar17->type = '\x02';
                psVar17->x = sVar26;
                psVar17->y = sVar2;
                psVar17->cx = 0;
                sVar19 = 0;
              }
              else {
                psVar17->type = '\x03';
                psVar17->x = sVar26;
                psVar17->y = sVar2;
                psVar17->cx = (short)cx;
              }
              psVar17->cy = sVar19;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx_00 = cx;
              cy_00 = cy;
            }
          }
          iVar11 = iVar22 + 1;
          cx = cx_00;
          cy = cy_00;
        } while (iVar22 < (int)(iVar20 + (uint)bVar1));
        iVar11 = stbtt__close_shape(psVar14,num_vertices,was_off,start_off,sx,sy,sVar21,sVar30,cx_00
                                    ,cy_00);
      }
      if (psVar14 == (stbtt_vertex *)0x0) {
        return 0;
      }
    }
    *pvertices = psVar14;
  }
  return iVar11;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}